

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFile.cc
# Opt level: O0

ostream * avro::operator<<(ostream *os,DataFileSync *s)

{
  char cVar1;
  size_type sVar2;
  byte *pbVar3;
  ostream *poVar4;
  array<unsigned_char,_16UL> *in_RSI;
  ostream *in_RDI;
  size_t i;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    sVar2 = boost::array<unsigned_char,_16UL>::size();
    if (sVar2 <= local_18) break;
    pbVar3 = boost::array<unsigned_char,_16UL>::operator[](in_RSI,local_18);
    cVar1 = hex(*pbVar3 / 0x10);
    poVar4 = std::operator<<(in_RDI,cVar1);
    pbVar3 = boost::array<unsigned_char,_16UL>::operator[](in_RSI,local_18);
    cVar1 = hex((uint)*pbVar3 % 0x10);
    poVar4 = std::operator<<(poVar4,cVar1);
    std::operator<<(poVar4,' ');
    local_18 = local_18 + 1;
  }
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  return in_RDI;
}

Assistant:

std::ostream& operator << (std::ostream& os, const DataFileSync& s)
{
    for (size_t i = 0; i < s.size(); ++i) {
        os << hex(s[i] / 16)  << hex(s[i] % 16) << ' ';
    }
    os << std::endl;
    return os;
}